

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuTexture.cpp
# Opt level: O0

IVec4 __thiscall
tcu::ConstPixelBufferAccess::getPixelInt(ConstPixelBufferAccess *this,int x,int y,int z)

{
  Channel CVar1;
  deInt32 x_;
  deInt32 y_;
  deInt32 z_;
  deInt32 w_;
  int iVar2;
  int iVar3;
  TextureSwizzle *pTVar4;
  int *piVar5;
  undefined8 extraout_RDX;
  undefined4 in_register_00000034;
  ConstPixelBufferAccess *this_00;
  int in_R8D;
  IVec4 IVar7;
  Vector<int,_4> VVar8;
  int local_140;
  int c;
  int channelSize;
  Channel *channelMap;
  Vector<unsigned_int,_4> local_120;
  Vector<int,_4> local_110;
  Vector<unsigned_int,_4> local_100;
  tcu local_f0 [16];
  Vector<unsigned_int,_4> local_e0;
  Vector<unsigned_int,_4> local_d0;
  Vector<unsigned_int,_4> local_c0;
  Vector<unsigned_int,_4> local_b0;
  Vector<unsigned_int,_4> local_a0;
  Vector<unsigned_int,_4> local_90;
  Vector<unsigned_int,_4> local_80;
  Vector<unsigned_int,_4> local_70;
  Vector<unsigned_int,_4> local_60;
  Vector<unsigned_int,_4> local_50;
  undefined1 local_40 [8];
  IVec4 result;
  deUint8 *pixelPtr;
  int z_local;
  int y_local;
  int x_local;
  ConstPixelBufferAccess *this_local;
  undefined8 uVar6;
  
  this_00 = (ConstPixelBufferAccess *)CONCAT44(in_register_00000034,x);
  result.m_data._8_8_ = getPixelPtr(this_00,y,z,in_R8D);
  Vector<int,_4>::Vector((Vector<int,_4> *)local_40);
  if ((this_00->m_format).type == UNORM_INT8) {
    if (((this_00->m_format).order == RGBA) || ((this_00->m_format).order == sRGBA)) {
      IVar7 = anon_unknown_75::readRGBA8888Int
                        ((anon_unknown_75 *)this,(deUint8 *)result.m_data._8_8_);
      uVar6 = IVar7.m_data._8_8_;
      goto LAB_002ec275;
    }
    if (((this_00->m_format).order == RGB) || ((this_00->m_format).order == sRGB)) {
      IVar7 = anon_unknown_75::readRGB888Int((anon_unknown_75 *)this,(deUint8 *)result.m_data._8_8_)
      ;
      uVar6 = IVar7.m_data._8_8_;
      goto LAB_002ec275;
    }
  }
  switch((this_00->m_format).type) {
  case UNORM_BYTE_44:
  case UNSIGNED_BYTE_44:
    Vector<unsigned_int,_4>::Vector
              (&local_50,(int)(uint)*(byte *)result.m_data._8_8_ >> 4,
               *(byte *)result.m_data._8_8_ & 0xf,0,1);
    VVar8 = Vector<unsigned_int,_4>::cast<int>((Vector<unsigned_int,_4> *)this);
    uVar6 = VVar8.m_data._8_8_;
    break;
  case UNORM_SHORT_565:
  case UNSIGNED_SHORT_565:
    Vector<unsigned_int,_4>::Vector
              (&local_70,(int)(uint)*(ushort *)result.m_data._8_8_ >> 0xb,
               (int)(uint)*(ushort *)result.m_data._8_8_ >> 5 & 0x3f,
               *(ushort *)result.m_data._8_8_ & 0x1f,1);
    Vector<unsigned_int,_4>::cast<int>(&local_60);
    VVar8 = swizzleRB<int>((tcu *)this,(Vector<int,_4> *)&local_60,(this_00->m_format).order,RGB);
    uVar6 = VVar8.m_data._8_8_;
    break;
  case UNORM_SHORT_555:
    Vector<unsigned_int,_4>::Vector
              (&local_90,(int)(uint)*(ushort *)result.m_data._8_8_ >> 10 & 0x1f,
               (int)(uint)*(ushort *)result.m_data._8_8_ >> 5 & 0x1f,
               *(ushort *)result.m_data._8_8_ & 0x1f,1);
    Vector<unsigned_int,_4>::cast<int>(&local_80);
    VVar8 = swizzleRB<int>((tcu *)this,(Vector<int,_4> *)&local_80,(this_00->m_format).order,RGB);
    uVar6 = VVar8.m_data._8_8_;
    break;
  case UNORM_SHORT_4444:
  case UNSIGNED_SHORT_4444:
    Vector<unsigned_int,_4>::Vector
              (&local_b0,(int)(uint)*(ushort *)result.m_data._8_8_ >> 0xc,
               (int)(uint)*(ushort *)result.m_data._8_8_ >> 8 & 0xf,
               (int)(uint)*(ushort *)result.m_data._8_8_ >> 4 & 0xf,
               *(ushort *)result.m_data._8_8_ & 0xf);
    Vector<unsigned_int,_4>::cast<int>(&local_a0);
    VVar8 = swizzleRB<int>((tcu *)this,(Vector<int,_4> *)&local_a0,(this_00->m_format).order,RGBA);
    uVar6 = VVar8.m_data._8_8_;
    break;
  case UNORM_SHORT_5551:
  case UNSIGNED_SHORT_5551:
    Vector<unsigned_int,_4>::Vector
              (&local_d0,(int)(uint)*(ushort *)result.m_data._8_8_ >> 0xb,
               (int)(uint)*(ushort *)result.m_data._8_8_ >> 6 & 0x1f,
               (int)(uint)*(ushort *)result.m_data._8_8_ >> 1 & 0x1f,
               *(ushort *)result.m_data._8_8_ & 1);
    Vector<unsigned_int,_4>::cast<int>(&local_c0);
    VVar8 = swizzleRB<int>((tcu *)this,(Vector<int,_4> *)&local_c0,(this_00->m_format).order,RGBA);
    uVar6 = VVar8.m_data._8_8_;
    break;
  case UNORM_SHORT_1555:
    Vector<unsigned_int,_4>::Vector
              ((Vector<unsigned_int,_4> *)&channelMap,
               (int)(uint)*(ushort *)result.m_data._8_8_ >> 0xf,
               (int)(uint)*(ushort *)result.m_data._8_8_ >> 10 & 0x1f,
               (int)(uint)*(ushort *)result.m_data._8_8_ >> 5 & 0x1f,
               *(ushort *)result.m_data._8_8_ & 0x1f);
    Vector<unsigned_int,_4>::cast<int>(&local_120);
    VVar8 = Vector<int,_4>::swizzle((Vector<int,_4> *)this,(int)&local_120,1,2,3);
    uVar6 = VVar8.m_data._8_8_;
    break;
  case UNORM_INT_101010:
    Vector<unsigned_int,_4>::Vector
              (&local_e0,*(uint *)result.m_data._8_8_ >> 0x16,
               *(uint *)result.m_data._8_8_ >> 0xc & 0x3ff,*(uint *)result.m_data._8_8_ >> 2 & 0x3ff
               ,1);
    VVar8 = Vector<unsigned_int,_4>::cast<int>((Vector<unsigned_int,_4> *)this);
    uVar6 = VVar8.m_data._8_8_;
    break;
  case SNORM_INT_1010102_REV:
  case SIGNED_INT_1010102_REV:
    x_ = anon_unknown_75::signExtend(*(uint *)result.m_data._8_8_ & 0x3ff,10);
    y_ = anon_unknown_75::signExtend(*(uint *)result.m_data._8_8_ >> 10 & 0x3ff,10);
    z_ = anon_unknown_75::signExtend(*(uint *)result.m_data._8_8_ >> 0x14 & 0x3ff,10);
    w_ = anon_unknown_75::signExtend(*(uint *)result.m_data._8_8_ >> 0x1e,2);
    Vector<int,_4>::Vector(&local_110,x_,y_,z_,w_);
    VVar8 = swizzleRB<int>((tcu *)this,&local_110,(this_00->m_format).order,RGBA);
    uVar6 = VVar8.m_data._8_8_;
    break;
  case UNORM_INT_1010102_REV:
  case UNSIGNED_INT_1010102_REV:
    Vector<unsigned_int,_4>::Vector
              (&local_100,*(uint *)result.m_data._8_8_ & 0x3ff,
               *(uint *)result.m_data._8_8_ >> 10 & 0x3ff,
               *(uint *)result.m_data._8_8_ >> 0x14 & 0x3ff,*(uint *)result.m_data._8_8_ >> 0x1e);
    swizzleRB<unsigned_int>(local_f0,&local_100,(this_00->m_format).order,RGBA);
    VVar8 = Vector<unsigned_int,_4>::cast<int>((Vector<unsigned_int,_4> *)this);
    uVar6 = VVar8.m_data._8_8_;
    break;
  default:
    pTVar4 = getChannelReadSwizzle((this_00->m_format).order);
    iVar2 = getChannelSize((this_00->m_format).type);
    for (local_140 = 0; local_140 < 4; local_140 = local_140 + 1) {
      CVar1 = pTVar4->components[local_140];
      if (CVar1 < CHANNEL_ZERO) {
        iVar3 = anon_unknown_75::channelToInt
                          ((deUint8 *)
                           (result.m_data._8_8_ + (long)(int)(iVar2 * pTVar4->components[local_140])
                           ),(this_00->m_format).type);
        piVar5 = Vector<int,_4>::operator[]((Vector<int,_4> *)local_40,local_140);
        *piVar5 = iVar3;
      }
      else if (CVar1 == CHANNEL_ZERO) {
        piVar5 = Vector<int,_4>::operator[]((Vector<int,_4> *)local_40,local_140);
        *piVar5 = 0;
      }
      else if (CVar1 == CHANNEL_ONE) {
        piVar5 = Vector<int,_4>::operator[]((Vector<int,_4> *)local_40,local_140);
        *piVar5 = 1;
      }
    }
    Vector<int,_4>::Vector((Vector<int,_4> *)this,(Vector<int,_4> *)local_40);
    uVar6 = extraout_RDX;
  }
LAB_002ec275:
  IVar7.m_data[2] = (int)uVar6;
  IVar7.m_data[3] = (int)((ulong)uVar6 >> 0x20);
  IVar7.m_data._0_8_ = this;
  return (IVec4)IVar7.m_data;
}

Assistant:

IVec4 ConstPixelBufferAccess::getPixelInt (int x, int y, int z) const
{
	DE_ASSERT(de::inBounds(x, 0, m_size.x()));
	DE_ASSERT(de::inBounds(y, 0, m_size.y()));
	DE_ASSERT(de::inBounds(z, 0, m_size.z()));
	DE_ASSERT(!isCombinedDepthStencilType(m_format.type)); // combined types cannot be accessed directly
	DE_ASSERT(m_format.order != TextureFormat::DS); // combined formats cannot be accessed directly

	const deUint8* const	pixelPtr = (const deUint8*)getPixelPtr(x, y, z);
	IVec4					result;

	// Optimized fomats.
	if (m_format.type == TextureFormat::UNORM_INT8)
	{
		if (m_format.order == TextureFormat::RGBA || m_format.order == TextureFormat::sRGBA)
			return readRGBA8888Int(pixelPtr);
		else if (m_format.order == TextureFormat::RGB || m_format.order == TextureFormat::sRGB)
			return readRGB888Int(pixelPtr);
	}

#define U8(OFFS, COUNT)			((*((const deUint8* )pixelPtr) >> (OFFS)) & ((1<<(COUNT))-1))
#define U16(OFFS, COUNT)		((*((const deUint16*)pixelPtr) >> (OFFS)) & ((1<<(COUNT))-1))
#define U32(OFFS, COUNT)		((*((const deUint32*)pixelPtr) >> (OFFS)) & ((1<<(COUNT))-1))
#define S32(OFFS, COUNT)		signExtend(U32(OFFS, COUNT), (COUNT))

	switch (m_format.type)
	{
		case TextureFormat::UNSIGNED_BYTE_44:			// Fall-through
		case TextureFormat::UNORM_BYTE_44:				return			 UVec4(U8 ( 4,  4), U8 ( 0,  4), 0u, 1u).cast<int>();
		case TextureFormat::UNSIGNED_SHORT_565:			// Fall-through
		case TextureFormat::UNORM_SHORT_565:			return swizzleRB(UVec4(U16(11,  5), U16( 5,  6), U16( 0,  5), 1).cast<int>(), m_format.order, TextureFormat::RGB);
		case TextureFormat::UNORM_SHORT_555:			return swizzleRB(UVec4(U16(10,  5), U16( 5,  5), U16( 0,  5), 1).cast<int>(), m_format.order, TextureFormat::RGB);
		case TextureFormat::UNSIGNED_SHORT_4444:		// Fall-through
		case TextureFormat::UNORM_SHORT_4444:			return swizzleRB(UVec4(U16(12,  4), U16( 8,  4), U16( 4,  4), U16( 0, 4)).cast<int>(), m_format.order, TextureFormat::RGBA);
		case TextureFormat::UNSIGNED_SHORT_5551:		// Fall-through
		case TextureFormat::UNORM_SHORT_5551:			return swizzleRB(UVec4(U16(11,  5), U16( 6,  5), U16( 1,  5), U16( 0, 1)).cast<int>(), m_format.order, TextureFormat::RGBA);
		case TextureFormat::UNORM_INT_101010:			return			 UVec4(U32(22, 10), U32(12, 10), U32( 2, 10), 1).cast<int>();
		case TextureFormat::UNORM_INT_1010102_REV:		// Fall-through
		case TextureFormat::UNSIGNED_INT_1010102_REV:	return swizzleRB(UVec4(U32( 0, 10), U32(10, 10), U32(20, 10), U32(30, 2)), m_format.order, TextureFormat::RGBA).cast<int>();
		case TextureFormat::SNORM_INT_1010102_REV:		// Fall-through
		case TextureFormat::SIGNED_INT_1010102_REV:		return swizzleRB(IVec4(S32( 0, 10), S32(10, 10), S32(20, 10), S32(30, 2)), m_format.order, TextureFormat::RGBA);

		case TextureFormat::UNORM_SHORT_1555:
			DE_ASSERT(m_format.order == TextureFormat::ARGB);
			return UVec4(U16(15, 1), U16(10, 5), U16(5, 5), U16(0, 5)).cast<int>().swizzle(1,2,3,0); // ARGB -> RGBA

		default:
			break; // To generic path.
	}

#undef U8
#undef U16
#undef U32
#undef S32

	// Generic path.
	const TextureSwizzle::Channel*	channelMap	= getChannelReadSwizzle(m_format.order).components;
	int								channelSize	= getChannelSize(m_format.type);

	for (int c = 0; c < 4; c++)
	{
		switch (channelMap[c])
		{
			case TextureSwizzle::CHANNEL_0:
			case TextureSwizzle::CHANNEL_1:
			case TextureSwizzle::CHANNEL_2:
			case TextureSwizzle::CHANNEL_3:
				result[c] = channelToInt(pixelPtr + channelSize*((int)channelMap[c]), m_format.type);
				break;

			case TextureSwizzle::CHANNEL_ZERO:
				result[c] = 0;
				break;

			case TextureSwizzle::CHANNEL_ONE:
				result[c] = 1;
				break;

			default:
				DE_ASSERT(false);
		}
	}

	return result;
}